

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_verify_ext
              (mbedtls_pk_type_t type,void *options,mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg
              ,uchar *hash,size_t hash_len,uchar *sig,size_t sig_len)

{
  int iVar1;
  size_t sVar2;
  mbedtls_rsa_context *ctx_00;
  mbedtls_pk_rsassa_pss_options *pss_opts;
  int ret;
  size_t hash_len_local;
  uchar *hash_local;
  mbedtls_md_type_t md_alg_local;
  mbedtls_pk_context *ctx_local;
  void *options_local;
  mbedtls_pk_type_t type_local;
  
  if ((ctx == (mbedtls_pk_context *)0x0) || (ctx->pk_info == (mbedtls_pk_info_t *)0x0)) {
    options_local._4_4_ = -16000;
  }
  else {
    iVar1 = mbedtls_pk_can_do(ctx,type);
    if (iVar1 == 0) {
      options_local._4_4_ = -0x3f00;
    }
    else if (type == MBEDTLS_PK_RSASSA_PSS) {
      if ((md_alg == MBEDTLS_MD_NONE) && (0xffffffff < hash_len)) {
        options_local._4_4_ = -16000;
      }
      else if (options == (void *)0x0) {
        options_local._4_4_ = -16000;
      }
      else {
        sVar2 = mbedtls_pk_get_len(ctx);
        if (sig_len < sVar2) {
          options_local._4_4_ = -0x4380;
        }
        else {
          ctx_00 = mbedtls_pk_rsa(*ctx);
          options_local._4_4_ =
               mbedtls_rsa_rsassa_pss_verify_ext
                         (ctx_00,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,0,md_alg,
                          (uint)hash_len,hash,*options,*(int *)((long)options + 4),sig);
          if (options_local._4_4_ == 0) {
            sVar2 = mbedtls_pk_get_len(ctx);
            if (sVar2 < sig_len) {
              options_local._4_4_ = -0x3900;
            }
            else {
              options_local._4_4_ = 0;
            }
          }
        }
      }
    }
    else if (options == (void *)0x0) {
      options_local._4_4_ = mbedtls_pk_verify(ctx,md_alg,hash,hash_len,sig,sig_len);
    }
    else {
      options_local._4_4_ = -16000;
    }
  }
  return options_local._4_4_;
}

Assistant:

int mbedtls_pk_verify_ext( mbedtls_pk_type_t type, const void *options,
                   mbedtls_pk_context *ctx, mbedtls_md_type_t md_alg,
                   const unsigned char *hash, size_t hash_len,
                   const unsigned char *sig, size_t sig_len )
{
    if( ctx == NULL || ctx->pk_info == NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ! mbedtls_pk_can_do( ctx, type ) )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    if( type == MBEDTLS_PK_RSASSA_PSS )
    {
#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PKCS1_V21)
        int ret;
        const mbedtls_pk_rsassa_pss_options *pss_opts;

#if defined(MBEDTLS_HAVE_INT64)
        if( md_alg == MBEDTLS_MD_NONE && UINT_MAX < hash_len )
            return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );
#endif /* MBEDTLS_HAVE_INT64 */

        if( options == NULL )
            return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

        pss_opts = (const mbedtls_pk_rsassa_pss_options *) options;

        if( sig_len < mbedtls_pk_get_len( ctx ) )
            return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

        ret = mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_pk_rsa( *ctx ),
                NULL, NULL, MBEDTLS_RSA_PUBLIC,
                md_alg, (unsigned int) hash_len, hash,
                pss_opts->mgf1_hash_id,
                pss_opts->expected_salt_len,
                sig );
        if( ret != 0 )
            return( ret );

        if( sig_len > mbedtls_pk_get_len( ctx ) )
            return( MBEDTLS_ERR_PK_SIG_LEN_MISMATCH );

        return( 0 );
#else
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_RSA_C && MBEDTLS_PKCS1_V21 */
    }

    /* General case: no options */
    if( options != NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    return( mbedtls_pk_verify( ctx, md_alg, hash, hash_len, sig, sig_len ) );
}